

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
GetMonitoredItems(void *handle,UA_NodeId objectId,size_t inputSize,UA_Variant *input,
                 size_t outputSize,UA_Variant *output)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  UA_MonitoredItem *pUVar4;
  UA_Subscription *pUVar5;
  ulong __nmemb;
  
  pUVar5 = (UA_Subscription *)&methodCallSession->serverSubscriptions;
  do {
    pUVar5 = (pUVar5->listEntry).le_next;
    if (pUVar5 == (UA_Subscription *)0x0) {
      return 0x80280000;
    }
  } while (pUVar5->subscriptionID != *input->data);
  uVar1 = 0xffffffff;
  pUVar4 = (UA_MonitoredItem *)&pUVar5->monitoredItems;
  do {
    pUVar4 = (pUVar4->listEntry).le_next;
    uVar1 = uVar1 + 1;
  } while (pUVar4 != (UA_MonitoredItem *)0x0);
  if (uVar1 != 0) {
    __nmemb = (ulong)uVar1;
    pvVar2 = calloc(__nmemb,4);
    pvVar3 = calloc(__nmemb,4);
    pUVar4 = (pUVar5->monitoredItems).lh_first;
    if (pUVar4 != (UA_MonitoredItem *)0x0) {
      uVar1 = 0;
      do {
        *(UA_UInt32 *)((long)pvVar2 + (ulong)uVar1 * 4) = pUVar4->clientHandle;
        *(UA_UInt32 *)((long)pvVar3 + (ulong)uVar1 * 4) = pUVar4->itemId;
        uVar1 = uVar1 + 1;
        pUVar4 = (pUVar4->listEntry).le_next;
      } while (pUVar4 != (UA_MonitoredItem *)0x0);
    }
    output->data = (void *)0x0;
    output->arrayDimensionsSize = 0;
    *(undefined8 *)&output->storageType = 0;
    output->arrayLength = 0;
    output->arrayDimensions = (UA_UInt32 *)0x0;
    output->data = pvVar2;
    output->arrayLength = __nmemb;
    output->type = (UA_DataType *)0x13e4d0;
    output[1].data = (void *)0x0;
    output[1].arrayDimensionsSize = 0;
    *(undefined8 *)&output[1].storageType = 0;
    output[1].arrayLength = 0;
    output[1].arrayDimensions = (UA_UInt32 *)0x0;
    output[1].data = pvVar3;
    output[1].arrayLength = __nmemb;
    output[1].type = (UA_DataType *)0x13e4d0;
  }
  return 0;
}

Assistant:

static UA_StatusCode
GetMonitoredItems(void *handle, const UA_NodeId objectId, size_t inputSize,
                  const UA_Variant *input, size_t outputSize, UA_Variant *output) {
    UA_UInt32 subscriptionId = *((UA_UInt32*)(input[0].data));
    UA_Session* session = methodCallSession;
    UA_Subscription* subscription = UA_Session_getSubscriptionByID(session, subscriptionId);
    if(!subscription)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;

    UA_UInt32 sizeOfOutput = 0;
    UA_MonitoredItem* monitoredItem;
    LIST_FOREACH(monitoredItem, &subscription->monitoredItems, listEntry) {
        ++sizeOfOutput;
    }
    if(sizeOfOutput==0)
        return UA_STATUSCODE_GOOD;

    UA_UInt32* clientHandles = UA_Array_new(sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    UA_UInt32* serverHandles = UA_Array_new(sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    UA_UInt32 i = 0;
    LIST_FOREACH(monitoredItem, &subscription->monitoredItems, listEntry) {
        clientHandles[i] = monitoredItem->clientHandle;
        serverHandles[i] = monitoredItem->itemId;
        ++i;
    }
    UA_Variant_setArray(&output[0], clientHandles, sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    UA_Variant_setArray(&output[1], serverHandles, sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    return UA_STATUSCODE_GOOD;
}